

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_QueueClean(Pdr_Man_t *p)

{
  Pdr_Obl_t *p_00;
  
  while( true ) {
    p_00 = Pdr_QueuePop(p);
    if (p_00 == (Pdr_Obl_t *)0x0) break;
    Pdr_OblDeref(p_00);
  }
  return;
}

Assistant:

void Pdr_QueueClean( Pdr_Man_t * p )
{
    Pdr_Obl_t * pThis;
    while ( (pThis = Pdr_QueuePop(p)) )
        Pdr_OblDeref( pThis );
    pThis = NULL;
}